

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O3

_Bool GPU_IntersectClipRect(GPU_Target *target,GPU_Rect B,GPU_Rect *result)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar5;
  undefined4 uVar6;
  ulong uVar3;
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  _Bool _Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  GPU_Rect A;
  undefined1 uVar4;
  undefined1 uVar7;
  undefined3 uVar8;
  undefined2 uVar9;
  
  if (target != (GPU_Target *)0x0) {
    if (target->use_clip_rect == false) {
      uVar3._0_2_ = target->w;
      uVar3._2_2_ = target->h;
      uVar4 = target->using_virtual_resolution;
      uVar7 = target->field_0x25;
      uVar9 = target->base_w;
      uVar8 = CONCAT21(uVar9,uVar7);
      uVar3._4_4_ = CONCAT31(uVar8,uVar4);
      auVar10._8_4_ = 0;
      auVar10._0_8_ = uVar3;
      auVar10._12_2_ = uVar9;
      auVar11._8_2_ = (short)uVar3._4_4_;
      auVar11._0_8_ = uVar3;
      auVar11._10_4_ = auVar10._10_4_;
      auVar12._6_8_ = 0;
      auVar12._0_6_ = auVar11._8_6_;
      auVar15._0_4_ = (float)(ushort)(undefined2)uVar3;
      auVar15._4_4_ = (float)(int)CONCAT82(SUB148(auVar12 << 0x40,6),uVar3._2_2_);
      auVar15._8_4_ = (float)auVar11._8_4_;
      auVar15._12_4_ = (float)(auVar10._10_4_ >> 0x10);
      auVar14 = ZEXT416(0);
    }
    else {
      uVar1 = (target->clip_rect).x;
      uVar5 = (target->clip_rect).y;
      auVar14._4_4_ = uVar5;
      auVar14._0_4_ = uVar1;
      auVar14._8_8_ = 0;
      uVar2 = (target->clip_rect).w;
      uVar6 = (target->clip_rect).h;
      auVar15._4_4_ = (float)uVar6;
      auVar15._0_4_ = (float)uVar2;
      auVar15._8_8_ = 0;
    }
    A._0_8_ = auVar14._0_8_;
    A._8_8_ = auVar15._0_8_;
    _Var13 = GPU_IntersectRect(A,B,result);
    return _Var13;
  }
  return false;
}

Assistant:

GPU_bool GPU_IntersectClipRect(GPU_Target* target, GPU_Rect B, GPU_Rect* result)
{
    if(target == NULL)
        return GPU_FALSE;
    
    if(!target->use_clip_rect)
    {
        GPU_Rect A = {0, 0, target->w, target->h};
        return GPU_IntersectRect(A, B, result);
    }
    
    return GPU_IntersectRect(target->clip_rect, B, result);
}